

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmimeprovider.cpp
# Opt level: O3

LocaleHash __thiscall QMimeBinaryProvider::localeComments(QMimeBinaryProvider *this,QString *name)

{
  _Base_ptr p_Var1;
  const_iterator cVar2;
  QString *in_RDX;
  
  cVar2 = loadMimeTypeExtra((QMimeBinaryProvider *)name,in_RDX);
  if (cVar2._M_node == (_Base_ptr)&name[4].d.ptr) {
    (this->super_QMimeProviderBase)._vptr_QMimeProviderBase = (_func_int **)0x0;
  }
  else {
    p_Var1 = cVar2._M_node[1]._M_right;
    (this->super_QMimeProviderBase)._vptr_QMimeProviderBase = (_func_int **)p_Var1;
    if ((p_Var1 != (_Base_ptr)0x0) && (p_Var1->_M_color != ~_S_red)) {
      LOCK();
      p_Var1->_M_color = p_Var1->_M_color + _S_black;
      UNLOCK();
    }
  }
  return (LocaleHash)(Data *)this;
}

Assistant:

QMimeTypePrivate::LocaleHash QMimeBinaryProvider::localeComments(const QString &name)
{
    MimeTypeExtraMap::const_iterator it = loadMimeTypeExtra(name);
    if (it != m_mimetypeExtra.cend())
        return it->second.localeComments;
    return {};
}